

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall
Parser::createLocalVarDeclarationNode
          (Parser *this,Token *t,vector<Node_*,_std::allocator<Node_*>_> *var_keys,
          vector<Node_*,_std::allocator<Node_*>_> *optional_values)

{
  pointer ppNVar1;
  Node *this_00;
  Node *this_01;
  ulong uVar2;
  long lVar3;
  Node *declarator;
  Node *local_48;
  vector<Node_*,_std::allocator<Node_*>_> *local_40;
  Parser *local_38;
  
  local_40 = optional_values;
  this_00 = (Node *)operator_new(0x30);
  local_38 = this;
  Node::Node(this_00,this->ctx,t);
  this_00->nodeType = PNT_LOCAL_VAR_DECLARATION;
  lVar3 = 0;
  local_48 = this_00;
  for (uVar2 = 0;
      ppNVar1 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_01 = (Node *)operator_new(0x30);
    Node::Node(this_01,local_38->ctx,*(Token **)(*(long *)((long)ppNVar1 + lVar3) + 8));
    this_01->nodeType = PNT_VAR_DECLARATOR;
    declarator = this_01;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              (&this_01->children,
               (value_type *)
               ((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar3));
    ppNVar1 = (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (*(long *)((long)ppNVar1 + lVar3) != 0) {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                (&declarator->children,(value_type *)((long)ppNVar1 + lVar3));
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this_00->children,&declarator);
    lVar3 = lVar3 + 8;
  }
  return local_48;
}

Assistant:

Node * createLocalVarDeclarationNode(Token & t, vector<Node *> var_keys, vector<Node *> optional_values)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_LOCAL_VAR_DECLARATION;

    for (size_t i = 0; i < var_keys.size(); i++)
    {
      Node * declarator = new Node(ctx, var_keys[i]->tok);
      declarator->nodeType = PNT_VAR_DECLARATOR;
      declarator->children.push_back(var_keys[i]);
      if (optional_values[i])
        declarator->children.push_back(optional_values[i]);
      n->children.push_back(declarator);
    }

    return n;
  }